

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O0

void testwin7(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  Am_Style local_40 [8];
  Am_Style local_38 [24];
  Am_Style local_20 [8];
  int local_18;
  int local_14;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  local_14 = ar_len;
  _i = wins_ar;
  printf("Entering testwin7:\n");
  printf("  Hit RETURN to change background color of D2:");
  getchar();
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    pAVar1 = _i[local_18].d2;
    Am_Style::Am_Style(local_20,(Am_Style *)&yellow);
    (**(code **)(*(long *)pAVar1 + 0x80))(pAVar1,local_20);
    Am_Style::~Am_Style(local_20);
  }
  printf("  Hit RETURN to revert background color of D2:");
  getchar();
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    pAVar1 = _i[local_18].d2;
    Am_Style::Am_Style(local_38,(Am_Style *)&green);
    (**(code **)(*(long *)pAVar1 + 0x80))(pAVar1,local_38);
    Am_Style::~Am_Style(local_38);
  }
  printf("  Hit RETURN to change background color of D1:");
  getchar();
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    pAVar1 = _i[local_18].d1;
    Am_Style::Am_Style(local_40,(Am_Style *)&purple);
    (**(code **)(*(long *)pAVar1 + 0x80))(pAVar1,local_40);
    Am_Style::~Am_Style(local_40);
  }
  return;
}

Assistant:

void
testwin7(wins *wins_ar, int ar_len)
{

  printf("Entering testwin7:\n");
  printf("  Hit RETURN to change background color of D2:");
  getchar();
  int i;
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d2)->Set_Background_Color(yellow);
  }

  printf("  Hit RETURN to revert background color of D2:");
  getchar();
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d2)->Set_Background_Color(green);
  }

  printf("  Hit RETURN to change background color of D1:");
  getchar();
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d1)->Set_Background_Color(purple);
  }
}